

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamer.cpp
# Opt level: O0

void __thiscall streamer::Streamer::cleanup(Streamer *this,EVP_PKEY_CTX *ctx)

{
  Streamer *this_local;
  
  if (this->out_codec_ctx != (AVCodecContext *)0x0) {
    avcodec_close(this->out_codec_ctx);
    avcodec_free_context(&this->out_codec_ctx);
  }
  if (this->format_ctx != (AVFormatContext *)0x0) {
    if (this->format_ctx->pb != (AVIOContext *)0x0) {
      avio_close(this->format_ctx->pb);
    }
    avformat_free_context(this->format_ctx);
    this->format_ctx = (AVFormatContext *)0x0;
  }
  return;
}

Assistant:

void Streamer::cleanup()
{
    if(out_codec_ctx) {
        avcodec_close(out_codec_ctx);
        avcodec_free_context(&out_codec_ctx);
    }

    if(format_ctx) {
        if(format_ctx->pb) {
            avio_close(format_ctx->pb);
        }
        avformat_free_context(format_ctx);
        format_ctx = nullptr;
    }
}